

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::SerializedModel::_InternalParse
          (SerializedModel *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  SerializedModel *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ReadTag
                            ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
      tag_00 = str._4_4_;
      if (str._4_4_ >> 3 == 1) break;
      if ((str._4_4_ >> 3 != 2) || ((str._4_4_ & 0xff) != 0x12)) goto LAB_002a3496;
      psVar2 = _internal_mutable_model_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar2,(char *)ctx_local,pPStack_20);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
    }
    if ((str._4_4_ & 0xff) == 10) {
      psVar2 = _internal_mutable_identifier_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar2,(char *)ctx_local,pPStack_20);
      bVar1 = google::protobuf::internal::VerifyUTF8(psVar2,(char *)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (char *)0x0;
      }
    }
    else {
LAB_002a3496:
      if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SerializedModel::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string identifier = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_identifier();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes model = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_model();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}